

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleUpCheckOperator::Operation<short,duckdb::hugeint_t>
                    (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  hugeint_t hVar4;
  string error;
  allocator local_a1;
  hugeint_t local_a0;
  string local_80;
  string local_60;
  string local_40 [32];
  
  sVar1 = *(short *)((long)dataptr + 0x20);
  uVar3 = (uint)input;
  if ((input < sVar1) &&
     (uVar2 = -(int)sVar1, uVar3 != uVar2 && SBORROW4(uVar3,uVar2) == (int)(uVar3 + (int)sVar1) < 0)
     ) {
    local_a0 = Cast::Operation<short,duckdb::hugeint_t>(input);
    hVar4 = hugeint_t::operator*(&local_a0,(hugeint_t *)((long)dataptr + 0x28));
  }
  else {
    ::std::__cxx11::string::string
              (local_40,"Casting value \"%s\" to type %s failed: value is out of range!",&local_a1);
    Decimal::ToString_abi_cxx11_
              (&local_60,(Decimal *)(ulong)uVar3,(ushort)*(byte *)((long)dataptr + 0x38),
               *(uint8_t *)((long)dataptr + 0x39),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_80,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&local_a0,(StringUtil *)local_40,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string(local_40);
    hVar4 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      ((string *)&local_a0,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  return hVar4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}